

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O0

int __thiscall QFactoryLoader::indexOf(QFactoryLoader *this,QString *needle)

{
  bool bVar1;
  qsizetype qVar2;
  QCborContainerPrivate *defaultValue;
  long in_FS_OFFSET;
  QCborValueConstRef QVar3;
  QCborArray *__range2;
  QCborArray *keys;
  int i;
  QCborValueConstRef key;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QCborArray> metaDataList;
  undefined4 in_stack_fffffffffffffed8;
  CaseSensitivity in_stack_fffffffffffffedc;
  QList<QCborArray> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  QCborValueConstRef *this_00;
  QCborContainerPrivate *local_f0;
  int local_a4;
  int local_8c;
  QFactoryLoader *in_stack_ffffffffffffff90;
  QCborValueConstRef local_38;
  QList<QCborArray> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QCborArray *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  metaDataKeys(in_stack_ffffffffffffff90);
  local_a4 = 0;
  do {
    qVar2 = QList<QCborArray>::size(&local_20);
    if ((int)qVar2 <= local_a4) {
      local_8c = -1;
LAB_00445a50:
      QList<QCborArray>::~QList((QList<QCborArray> *)0x445a5d);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_8c;
      }
      __stack_chk_fail();
    }
    QList<QCborArray>::operator[]
              (in_stack_fffffffffffffee0,
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    local_38.d = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.i = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38 = (QCborValueConstRef)QCborArray::begin((QCborArray *)0x44588e);
    QVar3 = (QCborValueConstRef)QCborArray::end((QCborArray *)0x4458cd);
    while( true ) {
      this_00 = (QCborValueConstRef *)QVar3.i;
      local_f0 = QVar3.d;
      bVar1 = ::operator!=((ConstIterator *)in_stack_fffffffffffffee0,
                           (ConstIterator *)
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      if (!bVar1) break;
      QVar3 = QCborArray::ConstIterator::operator*
                        ((ConstIterator *)
                         CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      defaultValue = QVar3.d;
      QString::QString((QString *)0x445965);
      QCborValueConstRef::toString(this_00,(QString *)defaultValue);
      in_stack_fffffffffffffeec =
           QString::compare((QString *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                            ,(QString *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      QString::~QString((QString *)0x4459a9);
      QString::~QString((QString *)0x4459b6);
      if (in_stack_fffffffffffffeec == 0) {
        local_8c = local_a4;
        goto LAB_00445a50;
      }
      QCborArray::ConstIterator::operator++((ConstIterator *)&local_38);
      QVar3.i = (qsizetype)this_00;
      QVar3.d = local_f0;
    }
    local_a4 = local_a4 + 1;
  } while( true );
}

Assistant:

int QFactoryLoader::indexOf(const QString &needle) const
{
    const QList<QCborArray> metaDataList = metaDataKeys();
    for (int i = 0; i < int(metaDataList.size()); ++i) {
        const QCborArray &keys = metaDataList[i];
        for (QCborValueConstRef key : keys) {
            if (key.toString().compare(needle, Qt::CaseInsensitive) == 0)
                return i;
        }
    }
    return -1;
}